

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O2

bool __thiscall
absl::debugging_internal::anon_unknown_0::RustSymbolParser::ParseUndisambiguatedIdentifier
          (RustSymbolParser *this,char uppercase_namespace,int disambiguator)

{
  char cVar1;
  byte c;
  DecodeRustPunycodeOptions options;
  long lVar2;
  bool bVar3;
  Nullable<char_*> pcVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  char cVar9;
  char *pcVar10;
  char *pcVar11;
  int iVar12;
  undefined4 local_38;
  
  pcVar11 = this->encoding_;
  uVar6 = (ulong)(uint)this->pos_;
  uVar8 = (ulong)this->pos_;
  cVar1 = pcVar11[uVar8];
  cVar9 = cVar1;
  if (cVar1 == 'u') {
    uVar6 = uVar8 + 1;
    this->pos_ = (int)uVar6;
    lVar2 = uVar8 + 1;
    uVar8 = uVar6;
    cVar9 = pcVar11[lVar2];
  }
  if (9 < (byte)(cVar9 - 0x30U)) {
    return false;
  }
  iVar5 = (int)uVar6 + 1;
  this->pos_ = iVar5;
  iVar7 = pcVar11[uVar8] + -0x30;
  iVar12 = 0;
  if (iVar7 != 0) {
    for (pcVar10 = pcVar11 + iVar5; iVar12 = iVar7, (byte)(*pcVar10 - 0x30U) < 10;
        pcVar10 = pcVar10 + 1) {
      if (0xccccccb < iVar7) {
        return false;
      }
      iVar5 = iVar5 + 1;
      this->pos_ = iVar5;
      iVar7 = iVar7 * 10 + (int)*pcVar10 + -0x30;
    }
  }
  if (pcVar11[iVar5] == '_') {
    iVar5 = iVar5 + 1;
    this->pos_ = iVar5;
  }
  if (cVar1 == 'u') {
    options.punycode_end = pcVar11 + iVar5 + iVar12;
    options.punycode_begin = pcVar11 + iVar5;
    options.out_begin = this->out_;
    options.out_end = this->out_end_;
    pcVar4 = DecodeRustPunycode(options);
    this->out_ = pcVar4;
    if (pcVar4 == (Nullable<char_*>)0x0) {
      return false;
    }
    this->pos_ = this->pos_ + iVar12;
  }
  if (uppercase_namespace != '\0') {
    if (uppercase_namespace == 'S') {
      pcVar11 = "{shim";
LAB_002c68aa:
      bVar3 = Emit(this,pcVar11);
    }
    else {
      if (uppercase_namespace == 'C') {
        pcVar11 = "{closure";
        goto LAB_002c68aa;
      }
      bVar3 = EmitChar(this,'{');
      if (!bVar3) {
        return false;
      }
      bVar3 = EmitChar(this,uppercase_namespace);
    }
    if (bVar3 == false) {
      return false;
    }
    if ((0 < iVar12) && (bVar3 = Emit(this,":"), !bVar3)) {
      return false;
    }
  }
  if (cVar1 != 'u') {
    iVar5 = 0;
    if (0 < iVar12) {
      iVar5 = iVar12;
    }
    iVar5 = iVar5 + 1;
    while (iVar5 = iVar5 + -1, iVar5 != 0) {
      iVar12 = this->pos_;
      this->pos_ = iVar12 + 1;
      c = this->encoding_[iVar12];
      if ((((0x19 < (byte)((c & 0xdf) + 0xbf)) && (-1 < (char)c)) && (c != 0x5f)) &&
         ((byte)(c - 0x3a) < 0xf6)) {
        return false;
      }
      bVar3 = EmitChar(this,c);
      if (!bVar3) {
        return false;
      }
    }
  }
  if (uppercase_namespace == '\0') {
    return true;
  }
  bVar3 = EmitChar(this,'#');
  if (!bVar3) {
    return false;
  }
  if (disambiguator < 0) {
    cVar1 = '?';
  }
  else {
    if (disambiguator != 0) {
      pcVar11 = (char *)((long)&local_38 + 3);
      local_38 = 0;
      for (; 0 < disambiguator; disambiguator = (uint)disambiguator / 10) {
        pcVar11[-1] = (byte)((ulong)(uint)disambiguator % 10) | 0x30;
        pcVar11 = pcVar11 + -1;
      }
      bVar3 = Emit(this,pcVar11);
      goto LAB_002c69c4;
    }
    cVar1 = '0';
  }
  bVar3 = EmitChar(this,cVar1);
LAB_002c69c4:
  if ((bVar3 != false) && (bVar3 = EmitChar(this,'}'), bVar3)) {
    return true;
  }
  return false;
}

Assistant:

ABSL_MUST_USE_RESULT bool ParseUndisambiguatedIdentifier(
      char uppercase_namespace = '\0', int disambiguator = 0) {
    // undisambiguated-identifier -> u? decimal-number _? bytes
    const bool is_punycoded = Eat('u');
    if (!IsDigit(Peek())) return false;
    int num_bytes = 0;
    if (!ParseDecimalNumber(num_bytes)) return false;
    (void)Eat('_');  // optional separator, needed if a digit follows
    if (is_punycoded) {
      DecodeRustPunycodeOptions options;
      options.punycode_begin = &encoding_[pos_];
      options.punycode_end = &encoding_[pos_] + num_bytes;
      options.out_begin = out_;
      options.out_end = out_end_;
      out_ = DecodeRustPunycode(options);
      if (out_ == nullptr) return false;
      pos_ += static_cast<size_t>(num_bytes);
    }

    // Emit the beginnings of braced forms like {shim:vtable#0}.
    if (uppercase_namespace != '\0') {
      switch (uppercase_namespace) {
        case 'C':
          if (!Emit("{closure")) return false;
          break;
        case 'S':
          if (!Emit("{shim")) return false;
          break;
        default:
          if (!EmitChar('{') || !EmitChar(uppercase_namespace)) return false;
          break;
      }
      if (num_bytes > 0 && !Emit(":")) return false;
    }

    // Emit the name itself.
    if (!is_punycoded) {
      for (int i = 0; i < num_bytes; ++i) {
        const char c = Take();
        if (!IsIdentifierChar(c) &&
            // The spec gives toolchains the choice of Punycode or raw UTF-8 for
            // identifiers containing code points above 0x7f, so accept bytes
            // with the high bit set.
            (c & 0x80) == 0) {
          return false;
        }
        if (!EmitChar(c)) return false;
      }
    }

    // Emit the endings of braced forms, e.g., "#42}".
    if (uppercase_namespace != '\0') {
      if (!EmitChar('#')) return false;
      if (!EmitDisambiguator(disambiguator)) return false;
      if (!EmitChar('}')) return false;
    }

    return true;
  }